

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O1

int fts5StorageIntegrityCallback
              (void *pContext,int tflags,char *pToken,int nToken,int iUnused1,int iUnused2)

{
  int iVar1;
  uint nTerm;
  ulong uVar2;
  long lVar3;
  uint nTerm_00;
  ulong uVar4;
  long lVar5;
  int iVar6;
  int bPresent;
  int local_44;
  long local_40;
  Fts5Termset *local_38;
  
  nTerm_00 = 0x8000;
  if (nToken < 0x8000) {
    nTerm_00 = nToken;
  }
  if (((tflags & 1U) == 0) || (*(int *)((long)pContext + 0xc) == 0)) {
    *(int *)((long)pContext + 0xc) = *(int *)((long)pContext + 0xc) + 1;
  }
  local_38 = *(Fts5Termset **)((long)pContext + 0x18);
  iVar6 = *(int *)(*(long *)((long)pContext + 0x20) + 0x5c);
  if (iVar6 == 2) {
    iVar6 = *(int *)((long)pContext + 8);
  }
  else {
    if (iVar6 == 0) {
      iVar6 = *(int *)((long)pContext + 0xc) + -1;
      local_40 = (long)*(int *)((long)pContext + 8);
      goto LAB_001d464b;
    }
    iVar6 = 0;
  }
  local_40 = 0;
LAB_001d464b:
  iVar1 = sqlite3Fts5TermsetAdd(local_38,0,pToken,nTerm_00,&local_44);
  if (local_44 == 0 && iVar1 == 0) {
    uVar2 = ((long)iVar6 + (*pContext * 9 + local_40) * 9) * 9 + 0x30;
    if (0 < nToken) {
      uVar4 = 0;
      do {
        uVar2 = uVar2 * 9 + (long)pToken[uVar4];
        uVar4 = uVar4 + 1;
      } while (nTerm_00 != uVar4);
    }
    *(ulong *)((long)pContext + 0x10) = *(ulong *)((long)pContext + 0x10) ^ uVar2;
  }
  if ((iVar1 == 0) && (lVar3 = *(long *)((long)pContext + 0x20), 0 < *(int *)(lVar3 + 0x30))) {
    lVar5 = 0;
    do {
      nTerm = sqlite3Fts5IndexCharlenToBytelen
                        (pToken,nTerm_00,*(int *)(*(long *)(lVar3 + 0x38) + lVar5 * 4));
      iVar1 = 0;
      if ((nTerm != 0) &&
         (iVar1 = sqlite3Fts5TermsetAdd(local_38,(int)lVar5 + 1,pToken,nTerm,&local_44),
         local_44 == 0)) {
        uVar2 = lVar5 + ((*pContext * 9 + local_40) * 9 + (long)iVar6) * 9 + 0x31;
        if (0 < (int)nTerm) {
          uVar4 = 0;
          do {
            uVar2 = uVar2 * 9 + (long)pToken[uVar4];
            uVar4 = uVar4 + 1;
          } while (nTerm != uVar4);
        }
        *(ulong *)((long)pContext + 0x10) = *(ulong *)((long)pContext + 0x10) ^ uVar2;
      }
      if (iVar1 != 0) {
        return iVar1;
      }
      lVar5 = lVar5 + 1;
      lVar3 = *(long *)((long)pContext + 0x20);
      iVar1 = 0;
    } while (lVar5 < *(int *)(lVar3 + 0x30));
  }
  return iVar1;
}

Assistant:

static int fts5StorageIntegrityCallback(
  void *pContext,                 /* Pointer to Fts5IntegrityCtx object */
  int tflags,
  const char *pToken,             /* Buffer containing token */
  int nToken,                     /* Size of token in bytes */
  int iUnused1,                   /* Start offset of token */
  int iUnused2                    /* End offset of token */
){
  Fts5IntegrityCtx *pCtx = (Fts5IntegrityCtx*)pContext;
  Fts5Termset *pTermset = pCtx->pTermset;
  int bPresent;
  int ii;
  int rc = SQLITE_OK;
  int iPos;
  int iCol;

  UNUSED_PARAM2(iUnused1, iUnused2);
  if( nToken>FTS5_MAX_TOKEN_SIZE ) nToken = FTS5_MAX_TOKEN_SIZE;

  if( (tflags & FTS5_TOKEN_COLOCATED)==0 || pCtx->szCol==0 ){
    pCtx->szCol++;
  }

  switch( pCtx->pConfig->eDetail ){
    case FTS5_DETAIL_FULL:
      iPos = pCtx->szCol-1;
      iCol = pCtx->iCol;
      break;

    case FTS5_DETAIL_COLUMNS:
      iPos = pCtx->iCol;
      iCol = 0;
      break;

    default:
      assert( pCtx->pConfig->eDetail==FTS5_DETAIL_NONE );
      iPos = 0;
      iCol = 0;
      break;
  }

  rc = sqlite3Fts5TermsetAdd(pTermset, 0, pToken, nToken, &bPresent);
  if( rc==SQLITE_OK && bPresent==0 ){
    pCtx->cksum ^= sqlite3Fts5IndexEntryCksum(
        pCtx->iRowid, iCol, iPos, 0, pToken, nToken
    );
  }

  for(ii=0; rc==SQLITE_OK && ii<pCtx->pConfig->nPrefix; ii++){
    const int nChar = pCtx->pConfig->aPrefix[ii];
    int nByte = sqlite3Fts5IndexCharlenToBytelen(pToken, nToken, nChar);
    if( nByte ){
      rc = sqlite3Fts5TermsetAdd(pTermset, ii+1, pToken, nByte, &bPresent);
      if( bPresent==0 ){
        pCtx->cksum ^= sqlite3Fts5IndexEntryCksum(
            pCtx->iRowid, iCol, iPos, ii+1, pToken, nByte
        );
      }
    }
  }

  return rc;
}